

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O0

void __thiscall deqp::gls::BuiltinPrecisionTests::CFloatFunc2::~CFloatFunc2(CFloatFunc2 *this)

{
  CFloatFunc2 *this_local;
  
  (this->super_FloatFunc2).
  super_PrimitiveFunc<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
  .
  super_Func<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
  .super_FuncBase._vptr_FuncBase = (_func_int **)&PTR__CFloatFunc2_015c4028;
  std::__cxx11::string::~string((string *)&this->m_name);
  FloatFunc2::~FloatFunc2(&this->super_FloatFunc2);
  return;
}

Assistant:

CFloatFunc2	(const string&	name,
								 DoubleFunc2&	func)
						: m_name(name)
						, m_func(func)
	{
	}